

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::Snapshot::InitializeFromParent_ForSubdirsCommand(Snapshot *this)

{
  PositionType *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  PointerType pSVar4;
  PointerType pcVar5;
  string currentBinDir;
  string currentSrcDir;
  allocator local_a9;
  string local_a8;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  pcVar3 = GetDefinition(this,&local_68);
  std::__cxx11::string::string((string *)local_48,pcVar3,(allocator *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_CURRENT_BINARY_DIR","")
  ;
  pcVar3 = GetDefinition(this,&local_a8);
  std::__cxx11::string::string((string *)&local_68,pcVar3,(allocator *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  InitializeFromParent(this);
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_SOURCE_DIR","");
  std::__cxx11::string::string
            ((string *)local_88,(this->State->SourceDirectory)._M_dataplus._M_p,&local_a9);
  this_00 = &this->Position;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_a8,(char *)local_88[0]);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_BINARY_DIR","");
  std::__cxx11::string::string
            ((string *)local_88,(this->State->BinaryDirectory)._M_dataplus._M_p,&local_a9);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_a8,(char *)local_88[0]);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  std::__cxx11::string::string((string *)local_88,(char *)local_48[0],&local_a9);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_a8,(char *)local_88[0]);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_CURRENT_BINARY_DIR","")
  ;
  std::__cxx11::string::string((string *)local_88,local_68._M_dataplus._M_p,&local_a9);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_a8,(char *)local_88[0]);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void cmState::Snapshot::InitializeFromParent_ForSubdirsCommand()
{
  std::string currentSrcDir = this->GetDefinition("CMAKE_CURRENT_SOURCE_DIR");
  std::string currentBinDir = this->GetDefinition("CMAKE_CURRENT_BINARY_DIR");
  this->InitializeFromParent();
  this->SetDefinition("CMAKE_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR",
                      this->State->GetBinaryDirectory());

  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR", currentSrcDir.c_str());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR", currentBinDir.c_str());
}